

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O3

int run_test_tcp_connect_timeout(void)

{
  sa_family_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar3;
  long lVar4;
  anon_union_28_2_e90107a3_for_address *paVar5;
  ulong uVar6;
  uv_handle_t *unaff_RBX;
  uv_timer_t *puVar7;
  uv_connect_t *puVar8;
  uv_tcp_t *handle;
  uv_loop_t *unaff_R14;
  bool bVar9;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 auStack_510 [16];
  sockaddr_in6 sStack_500;
  uv_handle_t *puStack_4e0;
  uv_loop_t *puStack_4d8;
  uv_alloc_cb p_Stack_4c8;
  uv_read_cb p_Stack_4c0;
  undefined1 auStack_4b0 [16];
  undefined8 uStack_4a0;
  uv_utsname_t uStack_498;
  uv_handle_t *puStack_98;
  long lStack_88;
  long lStack_80;
  sockaddr_in sStack_78;
  uv_handle_t *puStack_68;
  uv_loop_t *puStack_60;
  undefined8 uStack_50;
  code *pcStack_48;
  uv_handle_t *puStack_40;
  void *local_30;
  undefined1 local_28 [24];
  
  puStack_40 = (uv_handle_t *)0x1c751d;
  iVar2 = uv_ip4_addr("8.8.8.8",9999,(sockaddr_in *)(local_28 + 8));
  local_28._0_8_ = SEXT48(iVar2);
  local_30 = (void *)0x0;
  if ((void *)local_28._0_8_ == (void *)0x0) {
    puStack_40 = (uv_handle_t *)0x1c7542;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c7551;
    iVar2 = uv_timer_init(puVar3,&timer);
    local_28._0_8_ = SEXT48(iVar2);
    local_30 = (void *)0x0;
    if ((void *)local_28._0_8_ != (void *)0x0) goto LAB_001c76ce;
    puStack_40 = (uv_handle_t *)0x1c758b;
    iVar2 = uv_timer_start(&timer,timer_cb,0x32,0);
    local_28._0_8_ = SEXT48(iVar2);
    local_30 = (void *)0x0;
    if ((void *)local_28._0_8_ != (void *)0x0) goto LAB_001c76dd;
    puStack_40 = (uv_handle_t *)0x1c75b0;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c75bf;
    iVar2 = uv_tcp_init(puVar3,&conn);
    local_28._0_8_ = SEXT48(iVar2);
    local_30 = (void *)0x0;
    if ((void *)local_28._0_8_ != (void *)0x0) goto LAB_001c76ec;
    puStack_40 = (uv_handle_t *)0x1c75fe;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)(local_28 + 8),connect_cb);
    if (iVar2 == -0x65) {
      puStack_40 = (uv_handle_t *)0x1c76b8;
      run_test_tcp_connect_timeout_cold_8();
      return 7;
    }
    local_28._0_8_ = SEXT48(iVar2);
    local_30 = (void *)0x0;
    if ((void *)local_28._0_8_ != (void *)0x0) goto LAB_001c76fb;
    puStack_40 = (uv_handle_t *)0x1c762c;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c7636;
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_28._0_8_ = SEXT48(iVar2);
    local_30 = (void *)0x0;
    if ((void *)local_28._0_8_ != (void *)0x0) goto LAB_001c770a;
    puStack_40 = (uv_handle_t *)0x1c765b;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_handle_t *)0x0;
    puStack_40 = (uv_handle_t *)0x1c7671;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puStack_40 = (uv_handle_t *)0x1c767b;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    local_28._0_8_ = (void *)0x0;
    puStack_40 = (uv_handle_t *)0x1c7689;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c7691;
    iVar2 = uv_loop_close(puVar3);
    local_30 = (void *)(long)iVar2;
    if ((void *)local_28._0_8_ == local_30) {
      puStack_40 = (uv_handle_t *)0x1c76a9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_40 = (uv_handle_t *)0x1c76ce;
    run_test_tcp_connect_timeout_cold_1();
LAB_001c76ce:
    puStack_40 = (uv_handle_t *)0x1c76dd;
    run_test_tcp_connect_timeout_cold_2();
LAB_001c76dd:
    puStack_40 = (uv_handle_t *)0x1c76ec;
    run_test_tcp_connect_timeout_cold_3();
LAB_001c76ec:
    puStack_40 = (uv_handle_t *)0x1c76fb;
    run_test_tcp_connect_timeout_cold_4();
LAB_001c76fb:
    puStack_40 = (uv_handle_t *)0x1c770a;
    run_test_tcp_connect_timeout_cold_5();
LAB_001c770a:
    puStack_40 = (uv_handle_t *)0x1c7719;
    run_test_tcp_connect_timeout_cold_6();
  }
  puVar7 = (uv_timer_t *)local_28;
  iVar2 = (int)&local_30;
  puStack_40 = (uv_handle_t *)timer_cb;
  run_test_tcp_connect_timeout_cold_7();
  puStack_40 = unaff_RBX;
  if (puVar7 == &timer) {
    pcStack_48 = (code *)0x1c774b;
    uv_close((uv_handle_t *)&conn,close_cb);
    uv_close((uv_handle_t *)&timer,close_cb);
    return extraout_EAX;
  }
  pcStack_48 = connect_cb;
  timer_cb_cold_1();
  if (puVar7 == (uv_timer_t *)&connect_req) {
    pcStack_48 = (code *)(long)iVar2;
    uStack_50 = 0xffffffffffffff83;
    if (pcStack_48 == (code *)0xffffffffffffff83) {
      connect_cb_called = connect_cb_called + 1;
      return iVar2;
    }
  }
  else {
    puStack_60 = (uv_loop_t *)0x1c779d;
    connect_cb_cold_1();
  }
  puStack_60 = (uv_loop_t *)run_test_tcp_local_connect_timeout;
  connect_cb_cold_2();
  puStack_98 = (uv_handle_t *)0x1c77b8;
  puStack_68 = unaff_RBX;
  puStack_60 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    puStack_98 = (uv_handle_t *)0x1c7971;
    run_test_tcp_local_connect_timeout_cold_9();
    return 7;
  }
  puStack_98 = (uv_handle_t *)0x1c77d6;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_78);
  lStack_80 = (long)iVar2;
  lStack_88 = 0;
  if (lStack_80 == 0) {
    puStack_98 = (uv_handle_t *)0x1c77fb;
    puVar3 = uv_default_loop();
    puStack_98 = (uv_handle_t *)0x1c780a;
    iVar2 = uv_timer_init(puVar3,&timer);
    lStack_80 = (long)iVar2;
    lStack_88 = 0;
    if (lStack_80 != 0) goto LAB_001c798e;
    puStack_98 = (uv_handle_t *)0x1c7844;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    lStack_80 = (long)iVar2;
    lStack_88 = 0;
    if (lStack_80 != 0) goto LAB_001c799d;
    puStack_98 = (uv_handle_t *)0x1c7869;
    puVar3 = uv_default_loop();
    puStack_98 = (uv_handle_t *)0x1c7878;
    iVar2 = uv_tcp_init(puVar3,&conn);
    lStack_80 = (long)iVar2;
    lStack_88 = 0;
    if (lStack_80 != 0) goto LAB_001c79ac;
    puStack_98 = (uv_handle_t *)0x1c78b7;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_78,connect_local_cb);
    if (iVar2 == -0x65) {
      puStack_98 = (uv_handle_t *)0x1c7978;
      run_test_tcp_local_connect_timeout_cold_8();
      return 7;
    }
    lStack_80 = (long)iVar2;
    lStack_88 = 0;
    if (lStack_80 != 0) goto LAB_001c79bb;
    puStack_98 = (uv_handle_t *)0x1c78e5;
    puVar3 = uv_default_loop();
    puStack_98 = (uv_handle_t *)0x1c78ef;
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_80 = (long)iVar2;
    lStack_88 = 0;
    if (lStack_80 != 0) goto LAB_001c79ca;
    puStack_98 = (uv_handle_t *)0x1c7914;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_handle_t *)0x0;
    puStack_98 = (uv_handle_t *)0x1c792a;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puStack_98 = (uv_handle_t *)0x1c7934;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    lStack_80 = 0;
    puStack_98 = (uv_handle_t *)0x1c7942;
    puVar3 = uv_default_loop();
    puStack_98 = (uv_handle_t *)0x1c794a;
    iVar2 = uv_loop_close(puVar3);
    lStack_88 = (long)iVar2;
    if (lStack_80 == lStack_88) {
      puStack_98 = (uv_handle_t *)0x1c7962;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_98 = (uv_handle_t *)0x1c798e;
    run_test_tcp_local_connect_timeout_cold_1();
LAB_001c798e:
    puStack_98 = (uv_handle_t *)0x1c799d;
    run_test_tcp_local_connect_timeout_cold_2();
LAB_001c799d:
    puStack_98 = (uv_handle_t *)0x1c79ac;
    run_test_tcp_local_connect_timeout_cold_3();
LAB_001c79ac:
    puStack_98 = (uv_handle_t *)0x1c79bb;
    run_test_tcp_local_connect_timeout_cold_4();
LAB_001c79bb:
    puStack_98 = (uv_handle_t *)0x1c79ca;
    run_test_tcp_local_connect_timeout_cold_5();
LAB_001c79ca:
    puStack_98 = (uv_handle_t *)0x1c79d9;
    run_test_tcp_local_connect_timeout_cold_6();
  }
  puStack_98 = (uv_handle_t *)is_supported_system;
  run_test_tcp_local_connect_timeout_cold_7();
  p_Stack_4c0 = (uv_read_cb)0x1c79fa;
  puStack_98 = unaff_RBX;
  iVar2 = uv_os_uname(&uStack_498);
  auStack_4b0._0_8_ = SEXT48(iVar2);
  uStack_4a0 = (uv__queue *)0x0;
  if ((uv_shutdown_t *)auStack_4b0._0_8_ == (uv_shutdown_t *)0x0) {
    if (CONCAT35(uStack_498.sysname._8_3_,uStack_498.sysname._3_5_) == 0x544e5f73776f64 &&
        CONCAT53(uStack_498.sysname._3_5_,uStack_498.sysname._0_3_) == 0x5f73776f646e6957) {
      p_Stack_4c0 = (uv_read_cb)0x1c7a74;
      iVar2 = sscanf(uStack_498.release,"%d.%d.%d",auStack_4b0,auStack_4b0 + 4,auStack_4b0 + 8);
      if (iVar2 != 3) {
        return 0;
      }
      lVar4 = 0;
      do {
        if (*(int *)((long)&DAT_00207bb0 + lVar4) < *(int *)(auStack_4b0 + lVar4)) {
          return 1;
        }
        if (*(int *)(auStack_4b0 + lVar4) < *(int *)((long)&DAT_00207bb0 + lVar4)) {
          return 0;
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
    }
    return 1;
  }
  puVar8 = (uv_connect_t *)auStack_4b0;
  iVar2 = (int)&uStack_4a0;
  p_Stack_4c0 = connect_local_cb;
  is_supported_system_cold_1();
  if (puVar8 == &connect_req) {
    p_Stack_4c0 = (uv_read_cb)(long)iVar2;
    p_Stack_4c8 = (uv_alloc_cb)0xffffffffffffff83;
    if (p_Stack_4c0 != (uv_read_cb)0xffffffffffffff83) {
      connect_cb_called = connect_cb_called + 1;
      return iVar2;
    }
  }
  else {
    puStack_4d8 = (uv_loop_t *)0x1c7aeb;
    connect_local_cb_cold_1();
  }
  puStack_4d8 = (uv_loop_t *)run_test_tcp6_local_connect_timeout;
  connect_local_cb_cold_2();
  puStack_4e0 = unaff_RBX;
  puStack_4d8 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    run_test_tcp6_local_connect_timeout_cold_10();
    return 7;
  }
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&sStack_500,(int *)auStack_510);
  if (iVar2 != 0) {
LAB_001c7d1d:
    run_test_tcp6_local_connect_timeout_cold_1();
    return 7;
  }
  if ((long)(int)auStack_510._0_4_ < 1) {
    uv_free_interface_addresses((uv_interface_address_t *)sStack_500._0_8_,auStack_510._0_4_);
    goto LAB_001c7d1d;
  }
  paVar5 = (anon_union_28_2_e90107a3_for_address *)(sStack_500._0_8_ + 0x14);
  uVar6 = 1;
  do {
    sVar1 = (paVar5->address4).sin_family;
    if (sVar1 == 10) break;
    paVar5 = (anon_union_28_2_e90107a3_for_address *)((long)paVar5 + 0x60);
    bVar9 = uVar6 < (ulong)(long)(int)auStack_510._0_4_;
    uVar6 = uVar6 + 1;
  } while (bVar9);
  uv_free_interface_addresses((uv_interface_address_t *)sStack_500._0_8_,auStack_510._0_4_);
  if (sVar1 != 10) goto LAB_001c7d1d;
  iVar2 = uv_ip6_addr("::1",9999,&sStack_500);
  auStack_510._0_8_ = SEXT48(iVar2);
  auStack_510._8_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_510._0_8_ == (uv_loop_t *)0x0) {
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,&timer);
    auStack_510._0_8_ = SEXT48(iVar2);
    auStack_510._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_510._0_8_ != (uv_loop_t *)0x0) goto LAB_001c7d47;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    auStack_510._0_8_ = SEXT48(iVar2);
    auStack_510._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_510._0_8_ != (uv_loop_t *)0x0) goto LAB_001c7d56;
    puVar3 = uv_default_loop();
    iVar2 = uv_tcp_init(puVar3,&conn);
    auStack_510._0_8_ = SEXT48(iVar2);
    auStack_510._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_510._0_8_ != (uv_loop_t *)0x0) goto LAB_001c7d65;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_500,connect_local_cb);
    if (iVar2 == -0x65) {
      run_test_tcp6_local_connect_timeout_cold_9();
      return 7;
    }
    auStack_510._0_8_ = SEXT48(iVar2);
    auStack_510._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_510._0_8_ != (uv_loop_t *)0x0) goto LAB_001c7d74;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_510._0_8_ = SEXT48(iVar2);
    auStack_510._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_510._0_8_ == (uv_loop_t *)0x0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_510._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      auStack_510._8_8_ = SEXT48(iVar2);
      if (auStack_510._0_8_ == auStack_510._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c7d92;
    }
  }
  else {
    run_test_tcp6_local_connect_timeout_cold_2();
LAB_001c7d47:
    run_test_tcp6_local_connect_timeout_cold_3();
LAB_001c7d56:
    run_test_tcp6_local_connect_timeout_cold_4();
LAB_001c7d65:
    run_test_tcp6_local_connect_timeout_cold_5();
LAB_001c7d74:
    run_test_tcp6_local_connect_timeout_cold_6();
  }
  run_test_tcp6_local_connect_timeout_cold_7();
LAB_001c7d92:
  handle = (uv_tcp_t *)auStack_510;
  run_test_tcp6_local_connect_timeout_cold_8();
  if (handle == (uv_tcp_t *)&timer || handle == &conn) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x399b,handle == &conn);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing((uv_handle_t *)handle);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}